

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O2

int secp256k1_modinv64_det_check_pow2(secp256k1_modinv64_trans2x2 *t,uint n,int abs)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  
  uVar3 = t->q * t->v;
  uVar4 = t->r * t->u;
  auVar1._8_8_ = (SUB168(SEXT816(t->r) * SEXT816(t->u),8) - SUB168(SEXT816(t->q) * SEXT816(t->v),8))
                 - (ulong)(uVar4 < uVar3);
  auVar1._0_8_ = uVar4 - uVar3;
  auVar5 = __ashlti3(1,0,n & 0xff);
  if (auVar5 == auVar1) {
    uVar2 = 1;
  }
  else {
    auVar5 = __ashlti3(0xffffffffffffffff,0xffffffffffffffff,n & 0xff);
    uVar2 = (uint)(auVar5 == auVar1 && abs != 0);
  }
  return uVar2;
}

Assistant:

static int secp256k1_modinv64_det_check_pow2(const secp256k1_modinv64_trans2x2 *t, unsigned int n, int abs) {
    secp256k1_int128 a;
    secp256k1_i128_det(&a, t->u, t->v, t->q, t->r);
    if (secp256k1_i128_check_pow2(&a, n, 1)) return 1;
    if (abs && secp256k1_i128_check_pow2(&a, n, -1)) return 1;
    return 0;
}